

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

void COVER_ctx_destroy(COVER_ctx_t *ctx)

{
  long in_RDI;
  
  if (in_RDI != 0) {
    if (*(long *)(in_RDI + 0x30) != 0) {
      free(*(void **)(in_RDI + 0x30));
      *(undefined8 *)(in_RDI + 0x30) = 0;
    }
    if (*(long *)(in_RDI + 0x40) != 0) {
      free(*(void **)(in_RDI + 0x40));
      *(undefined8 *)(in_RDI + 0x40) = 0;
    }
    if (*(long *)(in_RDI + 0x48) != 0) {
      free(*(void **)(in_RDI + 0x48));
      *(undefined8 *)(in_RDI + 0x48) = 0;
    }
    if (*(long *)(in_RDI + 8) != 0) {
      free(*(void **)(in_RDI + 8));
      *(undefined8 *)(in_RDI + 8) = 0;
    }
  }
  return;
}

Assistant:

static void COVER_ctx_destroy(COVER_ctx_t *ctx) {
  if (!ctx) {
    return;
  }
  if (ctx->suffix) {
    free(ctx->suffix);
    ctx->suffix = NULL;
  }
  if (ctx->freqs) {
    free(ctx->freqs);
    ctx->freqs = NULL;
  }
  if (ctx->dmerAt) {
    free(ctx->dmerAt);
    ctx->dmerAt = NULL;
  }
  if (ctx->offsets) {
    free(ctx->offsets);
    ctx->offsets = NULL;
  }
}